

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  code **ppcVar4;
  undefined8 *puVar5;
  byte bVar6;
  http_settings_s in_stack_fffffffffffffed8;
  char default_http_port [5];
  long http_port_long_int;
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  bVar6 = 0;
  builtin_strncpy(default_http_port,"3000",5);
  pcVar2 = getenv("RSHUTDOWN_TOKEN");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    pcVar2 = "RSHUTDOWN_TOKEN environment variable not set - exiting";
    iVar1 = 0x15;
LAB_0010482a:
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
            ,iVar1,pcVar2);
    iVar1 = 1;
  }
  else {
    pcVar2 = getenv("RSHUTDOWN_HTTP_PORT");
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x22,"RSHUTDOWN_HTTP_PORT environment variable not set - using default port");
      pcVar2 = default_http_port;
    }
    else {
      iVar1 = __isoc99_sscanf(pcVar2,"%ld",&http_port_long_int);
      if (iVar1 != 1) {
        pcVar2 = "RSHUTDOWN_HTTP_PORT set to invalid port number - exiting";
        iVar1 = 0x29;
        goto LAB_0010482a;
      }
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x2d,"RSHUTDOWN_HTTP_PORT environment variable set");
    }
    iVar1 = 0;
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
            ,0x31,"Listening on port %s",pcVar2);
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_90 = on_request;
    local_18 = 0x10000;
    ppcVar4 = &local_90;
    puVar5 = (undefined8 *)&stack0xfffffffffffffed8;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *ppcVar4;
      ppcVar4 = ppcVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    http_listen(pcVar2,(char *)0x0,in_stack_fffffffffffffed8);
    fio_start((fio_start_args)0x1);
  }
  return iVar1;
}

Assistant:

int main(void) {
  char default_http_port[] = "3000";
  char *http_port = default_http_port;
  long int http_port_long_int;

  /* check that RSHUTDOWN_TOKEN env var is set */
  if (getenv("RSHUTDOWN_TOKEN") == NULL || getenv("RSHUTDOWN_TOKEN")[0] == '\0') {
    log_error("RSHUTDOWN_TOKEN environment variable not set - exiting");
    return 1;
  }

  /* debug mode if compiled with NO_SHUTDOWN: display a message but don't shutdown */
#ifdef NO_SHUTDOWN
  log_info("NO_SHUTDOWN set - won't shutdown\n");
#endif

  /* use default port unless RSHUTDOWN_HTTP_PORT is set to another port */
  if (getenv("RSHUTDOWN_HTTP_PORT") == NULL
    || getenv("RSHUTDOWN_HTTP_PORT")[0] == '\0'
  ) {
    log_debug("RSHUTDOWN_HTTP_PORT environment variable not set - using default port");
  }
  else {
    http_port = getenv("RSHUTDOWN_HTTP_PORT");

    /* check if port is a valid number by attempting to convert it to a long int */
    if (sscanf(http_port, "%ld", &http_port_long_int) != 1) {
        log_error("RSHUTDOWN_HTTP_PORT set to invalid port number - exiting");
        return 1;
    }

    log_debug("RSHUTDOWN_HTTP_PORT environment variable set");
  }

  /* listen on any available network binding (NULL == 0.0.0.0) */
  log_info("Listening on port %s", http_port);
  http_listen(http_port, NULL, .on_request = on_request, .log = 1);

  /* start the server */
  fio_start(.threads = 1);
}